

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O2

void __thiscall HAXX_UNARY_OP::quaternion_unary_assign::test_method(quaternion_unary_assign *this)

{
  undefined8 local_120;
  undefined8 local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x95);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0x3ff0000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_58 = "";
  local_118 = 0x3ff0000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_60,0x95,1,2,&local_120,"q.real()",&local_118,"p.real()");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x96);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0x4000000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_88 = "";
  local_118 = 0x4000000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_90,0x96,1,2,&local_120,"q.imag_i()",&local_118,"p.imag_i()");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x97);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_118 = 0x4008000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b8 = "";
  local_120 = 0x4008000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_c0,0x97,1,2,&local_120,"q.imag_j()",&local_118,"p.imag_j()");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x98);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00150bc8;
  local_120 = 0x4010000000000000;
  local_118 = 0x4010000000000000;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_f0,0x98,1,2,&local_120,"q.imag_k()",&local_118,"p.imag_k()");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_unary_assign)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p = q;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),p.real());
  BOOST_CHECK_EQUAL(q.imag_i(),p.imag_i());
  BOOST_CHECK_EQUAL(q.imag_j(),p.imag_j());
  BOOST_CHECK_EQUAL(q.imag_k(),p.imag_k());

}